

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void armci_msg_reduce_scope(int scope,void *x,int n,char *op,int type)

{
  ARMCI_Group group_00;
  ARMCI_Group group;
  ARMCI_Group local_2c;
  
  if (scope != 0x151) {
    ARMCI_Group_get_default(&local_2c);
    do_gop(x,n,op,type,local_2c);
    return;
  }
  group_00 = ARMCI_Node_group;
  if (_number_of_procs_per_node < 2) {
    group_00 = -2;
  }
  do_gop(x,n,op,type,group_00);
  return;
}

Assistant:

void armci_msg_reduce_scope(int scope, void *x, int n, char *op, int type)
{
    if (SCOPE_NODE == scope) {
      if (_number_of_procs_per_node > 1) {
        do_gop(x, n, op, type, ARMCI_Node_group);
      } else {
        do_gop(x, n, op, type, ARMCI_GROUP_SELF);
      }
    } else {
        do_gop(x, n, op, type, get_default_group());
    }
}